

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3PcacheRelease(PgHdr *p)

{
  int *piVar1;
  i16 *piVar2;
  
  piVar1 = &p->pCache->nRefSum;
  *piVar1 = *piVar1 + -1;
  piVar2 = &p->nRef;
  *piVar2 = *piVar2 + -1;
  if (*piVar2 != 0) {
    return;
  }
  if ((p->flags & 1) == 0) {
    pcacheManageDirtyList(p,'\x03');
    return;
  }
  if (p->pCache->bPurgeable != '\0') {
    (*sqlite3Config.pcache2.xUnpin)(p->pCache->pCache,p->pPage,0);
    return;
  }
  return;
}

Assistant:

SQLITE_NOINLINE sqlite3PcacheRelease(PgHdr *p){
  assert( p->nRef>0 );
  p->pCache->nRefSum--;
  if( (--p->nRef)==0 ){
    if( p->flags&PGHDR_CLEAN ){
      pcacheUnpin(p);
    }else{
      pcacheManageDirtyList(p, PCACHE_DIRTYLIST_FRONT);
      assert( sqlite3PcachePageSanity(p) );
    }
  }
}